

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
testing::Matcher<std::optional<solitaire::cards::Card>_&>::Matcher
          (Matcher<std::optional<solitaire::cards::Card>_&> *this,
          optional<solitaire::cards::Card> *value)

{
  MatcherBase<std::optional<solitaire::cards::Card>_&> MStack_38;
  _Storage<solitaire::cards::Card,_true> local_20;
  undefined1 local_18;
  
  (this->super_MatcherBase<std::optional<solitaire::cards::Card>_&>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<std::optional<solitaire::cards::Card>_&>).super_MatcherDescriberInterface
  ._vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_002ecad0;
  local_20._M_value =
       *(Card *)&(value->super__Optional_base<solitaire::cards::Card,_true,_true>)._M_payload.
                 super__Optional_payload_base<solitaire::cards::Card>._M_payload;
  local_18 = (value->super__Optional_base<solitaire::cards::Card,_true,_true>)._M_payload.
             super__Optional_payload_base<solitaire::cards::Card>._M_engaged;
  Matcher<std::optional<solitaire::cards::Card>&>::
  Matcher<testing::internal::EqMatcher<std::optional<solitaire::cards::Card>>,void>
            ((Matcher<std::optional<solitaire::cards::Card>&> *)&MStack_38,
             (EqMatcher<std::optional<solitaire::cards::Card>_> *)&local_20._M_value);
  internal::MatcherBase<std::optional<solitaire::cards::Card>_&>::operator=
            (&this->super_MatcherBase<std::optional<solitaire::cards::Card>_&>,&MStack_38);
  internal::MatcherBase<std::optional<solitaire::cards::Card>_&>::~MatcherBase(&MStack_38);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }